

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

bool __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::dump_to_stream
          (array_n<float,_3,_std::allocator<float>_> *this,ofstream *stream)

{
  ulong uVar1;
  int local_2c;
  int i;
  uint size;
  uint sig;
  ofstream *stream_local;
  array_n<float,_3,_std::allocator<float>_> *this_local;
  
  _size = stream;
  stream_local = (ofstream *)this;
  uVar1 = std::ios::good();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    i = 0x53534c41;
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    }
    std::ostream::write((char *)_size,(long)&i);
    std::ostream::write((char *)_size,(long)this->_dims);
    std::ostream::write((char *)_size,(long)this->_array);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool dump_to_stream(std::ofstream &stream) const {
            if(!stream.good()) return false;

            unsigned int sig = 0x53534c41; // TODO: Move this sig out into a DEFINE

            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            stream.write((const char *)&sig, sizeof(unsigned int));
            stream.write((const char *)&_dims[0], N*sizeof(unsigned int));
            stream.write((const char *)_array, size*sizeof(T));

            return true;
        }